

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chart.cpp
# Opt level: O2

string * __thiscall
Chart::renderMonth_abi_cxx11_
          (string *__return_storage_ptr__,Chart *this,Datetime *previous,Datetime *day)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  int month;
  allocator<char> local_1c9;
  string local_1c8;
  stringstream out;
  ostream local_198 [376];
  
  iVar1 = Datetime::month(previous);
  iVar2 = Datetime::month(day);
  std::__cxx11::stringstream::stringstream((stringstream *)&out);
  if (iVar1 == iVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"   ",&local_1c9);
  }
  else {
    uVar3 = Datetime::month(day);
    Datetime::monthNameShort_abi_cxx11_(&local_1c8,(Datetime *)(ulong)uVar3,month);
  }
  poVar4 = std::operator<<(local_198,(string *)&local_1c8);
  std::operator<<(poVar4,' ');
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

std::string Chart::renderMonth (const Datetime& previous, const Datetime& day)
{
  const auto show_month = previous.month () != day.month ();

  std::stringstream out;

  out << (show_month ? Datetime::monthNameShort (day.month ()) : "   ")
      << ' ';

  return out.str ();
}